

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O3

int Cortex_CopyFrame(sFrameOfData *pSrc,sFrameOfData *pDst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  tMarkerData *__ptr;
  short *__dest;
  tForceData *__dest_00;
  double *__dest_01;
  long lVar5;
  
  iVar3 = pSrc->nBodies;
  pDst->iFrame = pSrc->iFrame;
  pDst->nBodies = iVar3;
  if (0 < (long)iVar3) {
    lVar5 = 0;
    do {
      iVar1 = *(int *)(pSrc->BodyData[0].szName + lVar5 + 0x80);
      iVar2 = iVar1 * 0xc;
      pvVar4 = *(void **)((long)&pDst->BodyData[0].Markers + lVar5);
      if (*(int *)(pDst->BodyData[0].szName + lVar5 + 0x80) != iVar1) {
        pvVar4 = realloc(pvVar4,(long)iVar2);
        if ((0 < iVar2) && (pvVar4 == (void *)0x0)) goto LAB_00105b1c;
        *(int *)(pDst->BodyData[0].szName + lVar5 + 0x80) = iVar1;
        *(void **)((long)&pDst->BodyData[0].Markers + lVar5) = pvVar4;
      }
      memcpy(pvVar4,*(void **)((long)&pSrc->BodyData[0].Markers + lVar5),(long)iVar2);
      iVar1 = *(int *)((long)&pSrc->BodyData[0].nSegments + lVar5);
      iVar2 = iVar1 * 0x38;
      pvVar4 = *(void **)((long)&pDst->BodyData[0].Segments + lVar5);
      if (*(int *)((long)&pDst->BodyData[0].nSegments + lVar5) != iVar1) {
        pvVar4 = realloc(pvVar4,(long)iVar2);
        if ((0 < iVar2) && (pvVar4 == (void *)0x0)) goto LAB_00105b1c;
        *(int *)((long)&pDst->BodyData[0].nSegments + lVar5) = iVar1;
        *(void **)((long)&pDst->BodyData[0].Segments + lVar5) = pvVar4;
      }
      memcpy(pvVar4,*(void **)((long)&pSrc->BodyData[0].Segments + lVar5),(long)iVar2);
      iVar2 = *(int *)((long)&pSrc->BodyData[0].nDofs + lVar5);
      iVar1 = iVar2 * 8;
      pvVar4 = *(void **)((long)&pDst->BodyData[0].Dofs + lVar5);
      if (*(int *)((long)&pDst->BodyData[0].nDofs + lVar5) != iVar2) {
        pvVar4 = realloc(pvVar4,(long)iVar1);
        if ((0 < iVar1) && (pvVar4 == (void *)0x0)) goto LAB_00105b1c;
        *(int *)((long)&pDst->BodyData[0].nDofs + lVar5) = iVar2;
        *(void **)((long)&pDst->BodyData[0].Dofs + lVar5) = pvVar4;
      }
      memcpy(pvVar4,*(void **)((long)&pSrc->BodyData[0].Dofs + lVar5),(long)iVar1);
      *(undefined4 *)((long)&pDst->BodyData[0].fAvgDofResidual + lVar5) =
           *(undefined4 *)((long)&pSrc->BodyData[0].fAvgDofResidual + lVar5);
      *(undefined8 *)((long)&pDst->BodyData[0].nIterations + lVar5) =
           *(undefined8 *)((long)&pSrc->BodyData[0].nIterations + lVar5);
      *(undefined4 *)((long)&pDst->BodyData[0].FocusEncoderValue + lVar5) =
           *(undefined4 *)((long)&pSrc->BodyData[0].FocusEncoderValue + lVar5);
      lVar5 = lVar5 + 0xc0;
    } while ((long)iVar3 * 0xc0 != lVar5);
  }
  iVar3 = pSrc->nUnidentifiedMarkers;
  iVar1 = iVar3 * 0xc;
  __ptr = pDst->UnidentifiedMarkers;
  if (pDst->nUnidentifiedMarkers == iVar3) {
LAB_001059b7:
    memcpy(__ptr,pSrc->UnidentifiedMarkers,(long)iVar1);
    iVar3 = (pSrc->AnalogData).nAnalogChannels;
    iVar1 = (pSrc->AnalogData).nAnalogSamples;
    iVar2 = iVar3 * iVar1 * 2;
    if (((pDst->AnalogData).nAnalogChannels == iVar3) &&
       ((pDst->AnalogData).nAnalogSamples == iVar1)) {
      __dest = (pDst->AnalogData).AnalogSamples;
    }
    else {
      __dest = (short *)realloc((pDst->AnalogData).AnalogSamples,(long)iVar2);
      if (__dest == (short *)0x0 && 0 < iVar2) goto LAB_00105b1c;
      (pDst->AnalogData).nAnalogChannels = iVar3;
      (pDst->AnalogData).nAnalogSamples = iVar1;
      (pDst->AnalogData).AnalogSamples = __dest;
    }
    memcpy(__dest,(pSrc->AnalogData).AnalogSamples,(long)iVar2);
    iVar3 = (pSrc->AnalogData).nForcePlates;
    iVar1 = (pSrc->AnalogData).nForceSamples;
    iVar2 = iVar3 * iVar1 * 0x1c;
    if (((pDst->AnalogData).nForcePlates == iVar3) && ((pDst->AnalogData).nForceSamples == iVar1)) {
      __dest_00 = (pDst->AnalogData).Forces;
    }
    else {
      __dest_00 = (tForceData *)realloc((pDst->AnalogData).Forces,(long)iVar2);
      if (__dest_00 == (tForceData *)0x0 && 0 < iVar2) goto LAB_00105b1c;
      (pDst->AnalogData).nForcePlates = iVar3;
      (pDst->AnalogData).nForceSamples = iVar1;
      (pDst->AnalogData).Forces = __dest_00;
    }
    memcpy(__dest_00,(pSrc->AnalogData).Forces,(long)iVar2);
    iVar3 = (pSrc->AnalogData).nAngleEncoders;
    iVar1 = (pSrc->AnalogData).nAngleEncoderSamples;
    iVar2 = iVar3 * iVar1 * 8;
    if (((pDst->AnalogData).nAngleEncoders == iVar3) &&
       ((pDst->AnalogData).nAngleEncoderSamples == iVar1)) {
      __dest_01 = (pDst->AnalogData).AngleEncoderSamples;
    }
    else {
      __dest_01 = (double *)realloc((pDst->AnalogData).AngleEncoderSamples,(long)iVar2);
      if (__dest_01 == (double *)0x0 && 0 < iVar2) goto LAB_00105b1c;
      (pDst->AnalogData).nAngleEncoders = iVar3;
      (pDst->AnalogData).nAngleEncoderSamples = iVar1;
      (pDst->AnalogData).AngleEncoderSamples = __dest_01;
    }
    memcpy(__dest_01,(pSrc->AnalogData).AngleEncoderSamples,(long)iVar2);
    iVar3 = 0;
  }
  else {
    __ptr = (tMarkerData *)realloc(__ptr,(long)iVar1);
    if (__ptr != (tMarkerData *)0x0 || iVar1 < 1) {
      pDst->nUnidentifiedMarkers = iVar3;
      pDst->UnidentifiedMarkers = __ptr;
      goto LAB_001059b7;
    }
LAB_00105b1c:
    Cortex_FreeFrame(pDst);
    iVar3 = 5;
  }
  return iVar3;
}

Assistant:

int Cortex_CopyFrame(const sFrameOfData* pSrc, sFrameOfData* pDst)
{
  int iBody;
  int nBodies = pSrc->nBodies;
  const sBodyData* SrcBody;
  sBodyData* DstBody;

  int n;
  void *ptr;
  int size;

  pDst->iFrame = pSrc->iFrame;

  pDst->nBodies = nBodies;

  for (iBody = 0; iBody < nBodies; iBody++) {
    SrcBody = &pSrc->BodyData[iBody];
    DstBody = &pDst->BodyData[iBody];

    // Copy Markers

    n = SrcBody->nMarkers;
    size = n * sizeof(tMarkerData);

    if (DstBody->nMarkers != n) {
      ptr = realloc(DstBody->Markers, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nMarkers = n;
      DstBody->Markers = (tMarkerData*) ptr;
    }

    memcpy(DstBody->Markers, SrcBody->Markers, size);

    // Copy Segments

    n = SrcBody->nSegments;
    size = n * sizeof(tSegmentData);

    if (DstBody->nSegments != n) {
      ptr = realloc(DstBody->Segments, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nSegments = n;
      DstBody->Segments = (tSegmentData*) ptr;
    }

    memcpy(DstBody->Segments, SrcBody->Segments, size);

    // Copy DOFs

    n = SrcBody->nDofs;
    size = n * sizeof(tDofData);

    if (DstBody->nDofs != n) {
      ptr = realloc(DstBody->Dofs, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nDofs = n;
      DstBody->Dofs = (tDofData*) ptr;
    }

    memcpy(DstBody->Dofs, SrcBody->Dofs, size);

    // Copy extra items
    DstBody->fAvgDofResidual = SrcBody->fAvgDofResidual;
    DstBody->nIterations = SrcBody->nIterations;
    DstBody->ZoomEncoderValue = SrcBody->ZoomEncoderValue;
    DstBody->FocusEncoderValue = SrcBody->FocusEncoderValue;
  }

  // Copy Unidentified Markers

  n = pSrc->nUnidentifiedMarkers;
  size = n * sizeof(tMarkerData);

  if (pDst->nUnidentifiedMarkers != n) {
    ptr = realloc(pDst->UnidentifiedMarkers, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    pDst->nUnidentifiedMarkers = n;
    pDst->UnidentifiedMarkers = (tMarkerData*) ptr;
  }

  memcpy(pDst->UnidentifiedMarkers, pSrc->UnidentifiedMarkers, size);

  // Copy Analog

  const sAnalogData* SrcAnalog = &pSrc->AnalogData;
  sAnalogData* DstAnalog = &pDst->AnalogData;

  // Analog Channels

  int nChannels = SrcAnalog->nAnalogChannels;
  int nSamples = SrcAnalog->nAnalogSamples;

  size = nChannels * nSamples * sizeof(short);

  if (DstAnalog->nAnalogChannels != nChannels || DstAnalog->nAnalogSamples
      != nSamples) {
    ptr = realloc(DstAnalog->AnalogSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAnalogChannels = nChannels;
    DstAnalog->nAnalogSamples = nSamples;
    DstAnalog->AnalogSamples = (short*) ptr;
  }

  memcpy(DstAnalog->AnalogSamples, SrcAnalog->AnalogSamples, size);

  // Forces Data

  int nForcePlates = SrcAnalog->nForcePlates;
  int nForceSamples = SrcAnalog->nForceSamples;

  size = nForcePlates * nForceSamples * sizeof(tForceData);

  if (DstAnalog->nForcePlates != nForcePlates || DstAnalog->nForceSamples
      != nForceSamples) {
    ptr = realloc(DstAnalog->Forces, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nForcePlates = nForcePlates;
    DstAnalog->nForceSamples = nForceSamples;
    DstAnalog->Forces = (tForceData*) ptr;
  }

  memcpy(DstAnalog->Forces, SrcAnalog->Forces, size);

  int nAngleEncoders = SrcAnalog->nAngleEncoders;
  int nAngleEncoderSamples = SrcAnalog->nAngleEncoderSamples;

  size = nAngleEncoders * nAngleEncoderSamples * sizeof(double);

  if (DstAnalog->nAngleEncoders != nAngleEncoders
      || DstAnalog->nAngleEncoderSamples != nAngleEncoderSamples) {
    ptr = realloc(DstAnalog->AngleEncoderSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAngleEncoders = nAngleEncoders;
    DstAnalog->nAngleEncoderSamples = nAngleEncoderSamples;
    DstAnalog->AngleEncoderSamples = (double*) ptr;
  }

  memcpy(DstAnalog->AngleEncoderSamples, SrcAnalog->AngleEncoderSamples, size);

  return RC_Okay;
}